

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::Image::uploadSurface
          (Image *this,ConstPixelBufferAccess *access,VkQueue queue,Allocator *allocator,
          VkImageLayout layout,VkOffset3D offset,VkImageAspectFlagBits aspect,uint mipLevel,
          uint arrayElement)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  VkImageAspectFlagBits aspect_local;
  VkImageLayout layout_local;
  Allocator *allocator_local;
  VkQueue queue_local;
  ConstPixelBufferAccess *access_local;
  Image *this_local;
  
  if (aspect == VK_IMAGE_ASPECT_COLOR_BIT) {
    iVar1 = tcu::ConstPixelBufferAccess::getWidth(access);
    iVar2 = tcu::ConstPixelBufferAccess::getHeight(access);
    iVar3 = tcu::ConstPixelBufferAccess::getDepth(access);
    pvVar4 = tcu::ConstPixelBufferAccess::getDataPtr(access);
    upload(this,queue,allocator,layout,offset,iVar1,iVar2,iVar3,mipLevel,arrayElement,
           VK_IMAGE_ASPECT_COLOR_BIT,VK_IMAGE_TYPE_2D,pvVar4);
  }
  if ((aspect == VK_IMAGE_ASPECT_DEPTH_BIT) || (aspect == VK_IMAGE_ASPECT_STENCIL_BIT)) {
    iVar1 = tcu::ConstPixelBufferAccess::getWidth(access);
    iVar2 = tcu::ConstPixelBufferAccess::getHeight(access);
    iVar3 = tcu::ConstPixelBufferAccess::getDepth(access);
    pvVar4 = tcu::ConstPixelBufferAccess::getDataPtr(access);
    uploadUsingBuffer(this,queue,allocator,layout,offset,iVar1,iVar2,iVar3,mipLevel,arrayElement,
                      aspect,pvVar4);
  }
  return;
}

Assistant:

void Image::uploadSurface (const tcu::ConstPixelBufferAccess&	access,
						   vk::VkQueue							queue,
						   vk::Allocator&						allocator,
						   vk::VkImageLayout					layout,
						   vk::VkOffset3D						offset,
						   vk::VkImageAspectFlagBits			aspect,
						   unsigned int							mipLevel,
						   unsigned int							arrayElement)
{
	if (aspect == vk::VK_IMAGE_ASPECT_COLOR_BIT)
	{
		upload(queue, allocator, layout, offset, access.getWidth(),
			access.getHeight(), access.getDepth(), mipLevel, arrayElement, aspect, vk::VK_IMAGE_TYPE_2D,
			access.getDataPtr());
	}
	if (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT || aspect == vk::VK_IMAGE_ASPECT_STENCIL_BIT)
	{
		uploadUsingBuffer(queue, allocator, layout, offset, access.getWidth(),
			access.getHeight(), access.getDepth(), mipLevel, arrayElement, aspect, access.getDataPtr());
	}
}